

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O3

void __thiscall
HighsHashTable<int,_std::pair<double,_int>_>::growTable
          (HighsHashTable<int,_std::pair<double,_int>_> *this)

{
  _Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false> _Var1;
  uchar *puVar2;
  u64 uVar3;
  long lVar4;
  _Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false> args;
  
  _Var1._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>.
       _M_head_impl;
  puVar2 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
  .super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>._M_head_impl =
       (HighsHashTableEntry<int,_std::pair<double,_int>_> *)0x0;
  (this->metadata)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  uVar3 = this->tableSizeMask;
  makeEmptyTable(this,uVar3 * 2 + 2);
  if (uVar3 != 0xffffffffffffffff) {
    lVar4 = 0;
    args._M_head_impl = _Var1._M_head_impl;
    do {
      if ((char)puVar2[lVar4] < '\0') {
        HighsHashTable<int,std::pair<double,int>>::
        insert<HighsHashTableEntry<int,std::pair<double,int>>>
                  ((HighsHashTable<int,std::pair<double,int>> *)this,args._M_head_impl);
      }
      lVar4 = lVar4 + 1;
      args._M_head_impl = args._M_head_impl + 1;
    } while (uVar3 + 1 != lVar4);
  }
  if (puVar2 != (uchar *)0x0) {
    operator_delete__(puVar2);
  }
  if (_Var1._M_head_impl != (HighsHashTableEntry<int,_std::pair<double,_int>_> *)0x0) {
    operator_delete(_Var1._M_head_impl);
    return;
  }
  return;
}

Assistant:

void growTable() {
    decltype(entries) oldEntries = std::move(entries);
    decltype(metadata) oldMetadata = std::move(metadata);
    u64 oldCapactiy = tableSizeMask + 1;

    makeEmptyTable(2 * oldCapactiy);

    for (u64 i = 0; i != oldCapactiy; ++i)
      if (occupied(oldMetadata[i])) insert(std::move(oldEntries.get()[i]));
  }